

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syserror.cpp
# Opt level: O1

string * SysErrorString_abi_cxx11_(int err)

{
  int in_ESI;
  string *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  char *s;
  char buf [1024];
  char *local_428;
  undefined8 local_41c;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_428 = (char *)0x0;
  local_428 = strerror_r(in_ESI,(char *)((long)&local_41c + 4),0x400);
  if (local_428 == (char *)0x0) {
    tinyformat::format<int>(in_RDI,"Unknown error (%d)",(int *)&local_41c);
  }
  else {
    tinyformat::format<char_const*,int>
              (in_RDI,(tinyformat *)"%s (%d)",(char *)&local_428,(char **)&local_41c,in_R8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string SysErrorString(int err)
{
    char buf[1024];
    /* Too bad there are three incompatible implementations of the
     * thread-safe strerror. */
    const char *s = nullptr;
#ifdef WIN32
    if (strerror_s(buf, sizeof(buf), err) == 0) s = buf;
#else
#ifdef STRERROR_R_CHAR_P /* GNU variant can return a pointer outside the passed buffer */
    s = strerror_r(err, buf, sizeof(buf));
#else /* POSIX variant always returns message in buffer */
    if (strerror_r(err, buf, sizeof(buf)) == 0) s = buf;
#endif
#endif
    if (s != nullptr) {
        return strprintf("%s (%d)", s, err);
    } else {
        return strprintf("Unknown error (%d)", err);
    }
}